

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O1

void __thiscall
TypedImageChannel<float>::resize(TypedImageChannel<float> *this,int width,int height)

{
  ulong uVar1;
  float *pfVar2;
  
  pfVar2 = (this->_pixels)._data;
  if (pfVar2 != (float *)0x0) {
    operator_delete__(pfVar2);
  }
  uVar1 = (long)height * (long)width;
  (this->_pixels)._sizeX = 0;
  (this->_pixels)._sizeY = 0;
  (this->_pixels)._data = (float *)0x0;
  pfVar2 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
  (this->_pixels)._data = pfVar2;
  (this->_pixels)._sizeX = (long)height;
  (this->_pixels)._sizeY = (long)width;
  return;
}

Assistant:

void
TypedImageChannel<T>::resize (int width, int height)
{
    _pixels.resizeEraseUnsafe (height, width);
}